

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O0

void dequeue_all(repl_p_head *head)

{
  repl_p_entry *prVar1;
  int local_1c;
  int counter;
  repl_p_entry *e;
  repl_p_head *head_local;
  
  local_1c = 0;
  do {
    prVar1 = (repl_p_entry *)ringbuf_trydequeue_s(head->ringbuf,0x20);
    if (prVar1 == (repl_p_entry *)0x0) {
      return;
    }
    if ((prVar1->node).tqe_next != (repl_p_entry *)0x0) {
      (((prVar1->node).tqe_next)->node).tqe_prev = (prVar1->node).tqe_prev;
      *(prVar1->node).tqe_prev = (prVar1->node).tqe_next;
      (prVar1->node).tqe_next = (repl_p_entry *)0x0;
      (prVar1->node).tqe_prev = (head->first).tqh_last;
      *(head->first).tqh_last = prVar1;
      (head->first).tqh_last = (repl_p_entry **)prVar1;
    }
    *prVar1->ptr_entry = prVar1;
    local_1c = local_1c + 1;
  } while (local_1c < 0x1000);
  return;
}

Assistant:

static void
dequeue_all(struct repl_p_head *head)
{
	struct repl_p_entry *e;
	int counter = 0;

	do {
		e = ringbuf_trydequeue_s(head->ringbuf,
						sizeof(struct repl_p_entry));
		if (e == NULL)
			break;

		TAILQ_MOVE_TO_TAIL(&head->first, e, node);

		/* unlock the entry, so that it can be used again */
		util_atomic_store_explicit64(e->ptr_entry, e,
						memory_order_relaxed);
		/*
		 * We are limiting the number of iterations,
		 * so that this loop ends for sure, because other thread
		 * can insert new elements to the ring buffer in the same time.
		 */
	} while (++counter < LEN_RING_BUF);
}